

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::ordered_dict<tinyusdz::Relationship>::insert
          (ordered_dict<tinyusdz::Relationship> *this,string *key,Relationship *value)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  
  cVar1 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
          ::find(&(this->_m)._M_t,key);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->_m)._M_t._M_impl.super__Rb_tree_header) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->_keys,key);
  }
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
           ::operator[](&this->_m,key);
  pmVar2->type = value->type;
  Path::operator=(&pmVar2->targetPath,&value->targetPath);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&pmVar2->targetPathVector,
             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&value->targetPathVector);
  pmVar2->listOpQual = value->listOpQual;
  AttrMetas::operator=(&pmVar2->_metas,&value->_metas);
  pmVar2->_varying_authored = value->_varying_authored;
  return;
}

Assistant:

void insert(const std::string &key, const T &value) {
    if (_m.count(key)) {
      // overwrite existing value
    } else {
      _keys.push_back(key);
    }

    _m[key] = value;
  }